

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,uint32_t needed)

{
  Allocator *pAVar1;
  size_t __size;
  RepeatedGroup *__dest;
  uint uVar2;
  
  if (this->capacity < needed) {
    uVar2 = needed + 7 & 0xfffffff8;
    __size = (ulong)uVar2 * 0x28;
    pAVar1 = this->allocator;
    if (pAVar1 == (Allocator *)0x0) {
      __dest = (RepeatedGroup *)realloc(this->items,__size);
    }
    else {
      __dest = (RepeatedGroup *)(**(code **)(*(long *)pAVar1 + 0x18))(pAVar1,this->items,__size);
    }
    if (__dest == (RepeatedGroup *)0x0) {
      pAVar1 = this->allocator;
      if (pAVar1 == (Allocator *)0x0) {
        __dest = (RepeatedGroup *)malloc(__size);
      }
      else {
        __dest = (RepeatedGroup *)(**(code **)(*(long *)pAVar1 + 0x10))(pAVar1,__size);
      }
      if ((ulong)this->size != 0) {
        memcpy(__dest,this->items,(ulong)this->size * 0x28);
      }
      if (this->allocator == (Allocator *)0x0) {
        free(this->items);
      }
      else {
        (**(code **)(*(long *)this->allocator + 0x20))();
      }
    }
    this->items = __dest;
    this->capacity = uVar2;
  }
  return;
}

Assistant:

void reserve (uint32_t needed)
    {
        if (capacity < needed)
        {
            needed = (needed + 7u) & ~7u;
            auto bytesNeeded = sizeof (ObjectType) * needed;

            if (auto reallocated = static_cast<ObjectType*> (resizeAllocationIfPossible (allocator, items, bytesNeeded)))
            {
                items = reallocated;
            }
            else
            {
                auto newItems = allocateBytes (allocator, bytesNeeded);

                if (size != 0)
                    std::memcpy (newItems, items, size * sizeof (ObjectType));

                freeBytes (allocator, items);
                items = static_cast<ObjectType*> (newItems);
            }

            capacity = needed;
        }
    }